

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

apx_error_t
apx_client_write_port_data(apx_client_t *self,apx_portInstance_t *port_instance,dtl_dv_t *dv)

{
  pthread_mutex_t *__mutex;
  apx_portType_t aVar1;
  uint32_t size;
  uint32_t offset;
  apx_error_t aVar2;
  apx_program_t *program;
  apx_vm_tag *self_00;
  apx_nodeInstance_tag *self_01;
  uint8_t *local_150;
  uint8_t stack_buffer [256];
  
  if (dv == (dtl_dv_t *)0x0 ||
      (port_instance == (apx_portInstance_t *)0x0 || self == (apx_client_t *)0x0)) {
    return 1;
  }
  size = apx_portInstance_data_size(port_instance);
  offset = apx_portInstance_data_offset(port_instance);
  program = apx_portInstance_pack_program(port_instance);
  aVar1 = apx_portInstance_port_type(port_instance);
  if (aVar1 != '\x01') {
    return 0x3e;
  }
  if (program == (apx_program_t *)0x0) {
    return 0x2e;
  }
  aVar2 = 2;
  if (size < 0x101) {
    local_150 = stack_buffer;
  }
  else {
    local_150 = (uint8_t *)malloc((ulong)size);
    if (local_150 == (uint8_t *)0x0) {
      return 2;
    }
  }
  __mutex = &self->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  self_00 = self->vm;
  if (self_00 == (apx_vm_tag *)0x0) {
    self_00 = apx_vm_new();
    self->vm = self_00;
    if (self_00 == (apx_vm_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      goto joined_r0x0012556e;
    }
  }
  aVar2 = apx_vm_select_program(self_00,program);
  if ((aVar2 == 0) && (aVar2 = apx_vm_set_write_buffer(self->vm,local_150,size), aVar2 == 0)) {
    aVar2 = apx_vm_pack_value(self->vm,dv);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (aVar2 == 0) {
    self_01 = apx_portInstance_parent(port_instance);
    aVar2 = apx_nodeInstance_write_provide_port_data(self_01,offset,local_150,size);
  }
joined_r0x0012556e:
  if (0x100 < size) {
    free(local_150);
  }
  return aVar2;
}

Assistant:

apx_error_t apx_client_write_port_data(apx_client_t* self, apx_portInstance_t* port_instance, const dtl_dv_t* dv)
{
   if ((self != NULL) && (port_instance != NULL) && (dv != NULL))
   {
      uint8_t stack_buffer[MAX_STACK_BUFFER_SIZE];
      apx_error_t result;
      uint8_t* write_buffer;
      bool is_heap_allocated_buffer = false;
      uint32_t const data_size = apx_portInstance_data_size(port_instance);
      uint32_t const offset = apx_portInstance_data_offset(port_instance);
      apx_program_t const* pack_program = apx_portInstance_pack_program(port_instance);

      if (apx_portInstance_port_type(port_instance) != APX_PROVIDE_PORT)
      {
         return APX_INVALID_PORT_HANDLE_ERROR;
      }
      if (pack_program == NULL)
      {
         return APX_INVALID_PROGRAM_ERROR;
      }
      if (data_size > MAX_STACK_BUFFER_SIZE)
      {
         write_buffer = (uint8_t*)malloc(data_size);
         if (write_buffer == NULL)
         {
            return APX_MEM_ERROR;
         }
         is_heap_allocated_buffer = true;
      }
      else
      {
         write_buffer = &stack_buffer[0];
      }
      assert(write_buffer != NULL);
      MUTEX_LOCK(self->lock);
      if (self->vm == NULL)
      {
         self->vm = apx_vm_new();
         if (self->vm == NULL)
         {
            MUTEX_UNLOCK(self->lock);
            if (is_heap_allocated_buffer) free(write_buffer);
            return APX_MEM_ERROR;
         }
      }
      assert(self->vm != NULL);
      result = apx_vm_select_program(self->vm, pack_program);
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_set_write_buffer(self->vm, write_buffer, data_size);
      }
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_pack_value(self->vm, dv);
      }
      MUTEX_UNLOCK(self->lock);
      if (result == APX_NO_ERROR)
      {
         result = apx_nodeInstance_write_provide_port_data(apx_portInstance_parent(port_instance), offset, write_buffer, data_size);
      }
      if (is_heap_allocated_buffer) free(write_buffer);
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}